

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::PrintTupleTo<std::tuple<int,int,int,int,int,int,int,int,int>,7ul>
               (long t,ostream *param_2)

{
  PrintTupleTo<std::tuple<int,int,int,int,int,int,int,int,int>,6ul>();
  std::operator<<(param_2,", ");
  internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
  PrintValue<int,void,std::ostream&>((int *)(t + 8),param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}